

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Scope __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::TranslateMemoryScope
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  bool bVar1;
  Scope local_1c;
  Scope scope;
  CoherentFlags *coherentFlags_local;
  TGlslangToSpvTraverser *this_local;
  
  local_1c = Max;
  if (((*(ushort *)coherentFlags >> 7 & 1) == 0) && (((uint)*coherentFlags & 1) == 0)) {
    if ((*(ushort *)coherentFlags >> 1 & 1) == 0) {
      if ((*(ushort *)coherentFlags >> 2 & 1) == 0) {
        if ((*(ushort *)coherentFlags >> 3 & 1) == 0) {
          if ((*(ushort *)coherentFlags >> 4 & 1) == 0) {
            if ((*(ushort *)coherentFlags >> 5 & 1) != 0) {
              local_1c = ScopeShaderCallKHR;
            }
          }
          else {
            local_1c = ScopeSubgroup;
          }
        }
        else {
          local_1c = ScopeWorkgroup;
        }
      }
      else {
        local_1c = QueueFamily;
      }
    }
    else {
      local_1c = Device;
    }
  }
  else {
    bVar1 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate);
    local_1c = Device;
    if (bVar1) {
      local_1c = QueueFamily;
    }
  }
  bVar1 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate);
  if ((bVar1) && (local_1c == Device)) {
    spv::Builder::addCapability(&this->builder,CapabilityVulkanMemoryModelDeviceScope);
  }
  return local_1c;
}

Assistant:

spv::Scope TGlslangToSpvTraverser::TranslateMemoryScope(
    const spv::Builder::AccessChain::CoherentFlags &coherentFlags)
{
    spv::Scope scope = spv::ScopeMax;

    if (coherentFlags.volatil || coherentFlags.coherent) {
        // coherent defaults to Device scope in the old model, QueueFamilyKHR scope in the new model
        scope = glslangIntermediate->usingVulkanMemoryModel() ? spv::ScopeQueueFamilyKHR : spv::ScopeDevice;
    } else if (coherentFlags.devicecoherent) {
        scope = spv::ScopeDevice;
    } else if (coherentFlags.queuefamilycoherent) {
        scope = spv::ScopeQueueFamilyKHR;
    } else if (coherentFlags.workgroupcoherent) {
        scope = spv::ScopeWorkgroup;
    } else if (coherentFlags.subgroupcoherent) {
        scope = spv::ScopeSubgroup;
    } else if (coherentFlags.shadercallcoherent) {
        scope = spv::ScopeShaderCallKHR;
    }
    if (glslangIntermediate->usingVulkanMemoryModel() && scope == spv::ScopeDevice) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelDeviceScopeKHR);
    }

    return scope;
}